

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Module::serialize_(Module *this,JSONWriter *w)

{
  pointer ppVar1;
  pointer pvVar2;
  JSONWriter *pJVar3;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar4;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  pointer ppVar5;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  pointer __v;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  name._M_str = "name";
  name._M_len = 4;
  pJVar3 = JSONWriter::key(w,name);
  std::__cxx11::string::string((string *)&local_90,(string *)&this->name_);
  JSONWriter::value<std::__cxx11::string>(pJVar3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  name_00._M_str = "instances";
  name_00._M_len = 9;
  pJVar3 = JSONWriter::key(w,name_00);
  JSONWriter::begin_array(pJVar3);
  ppVar1 = (this->instances_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (this->instances_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    pJVar3 = JSONWriter::begin_obj(w);
    name_01._M_str = "name";
    name_01._M_len = 4;
    pJVar3 = JSONWriter::key(pJVar3,name_01);
    std::__cxx11::string::string((string *)&local_50,(string *)ppVar5);
    pJVar3 = JSONWriter::value<std::__cxx11::string>(pJVar3,&local_50);
    name_02._M_str = "module";
    name_02._M_len = 6;
    pJVar3 = JSONWriter::key(pJVar3,name_02);
    std::__cxx11::string::string((string *)&local_b0,(string *)&ppVar5->second->name_);
    pJVar3 = JSONWriter::value<std::__cxx11::string>(pJVar3,&local_b0);
    JSONWriter::end_obj(pJVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  JSONWriter::end_array(w);
  name_03._M_str = "variables";
  name_03._M_len = 9;
  pJVar3 = JSONWriter::key(w,name_03);
  JSONWriter::begin_array(pJVar3);
  pvVar2 = (this->variables_).
           super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__v = (this->variables_).
             super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __v != pvVar2; __v = __v + 1) {
    if ((__v->super__Variant_base<hgdb::json::Variable,_unsigned_long>).
        super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
        super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
        super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
        super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
        super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long>._M_index == '\0') {
      this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(__v);
      Variable::serialize(this_00,w);
    }
    else {
      pvVar4 = std::get<1ul,hgdb::json::Variable,unsigned_long>(__v);
      std::__cxx11::to_string(&local_70,*pvVar4);
      JSONWriter::value<std::__cxx11::string>(w,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  JSONWriter::end_array(w);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("name").value(name_);
        w.key("instances").begin_array();
        for (auto const &[name, m] : instances_) {
            w.begin_obj().key("name").value(name).key("module").value(m->name_).end_obj();
        }
        w.end_array();
        w.key("variables").begin_array();
        for (auto const &v : variables_) {
            if (v.index() == 0) {
                std::get<0>(v).serialize(w);
            } else {
                w.value(std::to_string(std::get<1>(v)));
            }
        }
        w.end_array();
    }